

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  short *psVar1;
  mbedtls_mpi *pmVar2;
  mbedtls_mpi *pmVar3;
  int iVar4;
  int iVar5;
  undefined8 local_d8;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi G;
  mbedtls_mpi Y;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi U1;
  mbedtls_mpi U2;
  mbedtls_mpi TV;
  mbedtls_mpi V2;
  mbedtls_mpi TU;
  mbedtls_mpi V1;
  
  G._8_8_ = p_1;
  p_1[0] = 1;
  Y.p._0_4_ = 0x10001;
  iVar4 = mbedtls_mpi_cmp_mpi(N,(mbedtls_mpi *)&G.s);
  if (iVar4 < 1) {
    return -4;
  }
  TA.p._0_4_ = 1;
  TB.s = 0;
  TB.n = 0;
  TB._12_4_ = 0;
  TU.p._0_4_ = 1;
  V2.s = 0;
  V2.n = 0;
  V2._12_4_ = 0;
  U1.p._0_4_ = 1;
  TA.s = 0;
  TA.n = 0;
  TA._12_4_ = 0;
  U2.p._0_4_ = 1;
  U1.s = 0;
  U1.n = 0;
  U1._12_4_ = 0;
  G.p._0_4_ = 1;
  p_1[0] = 0;
  TB.p._0_4_ = 1;
  Y.s = 0;
  Y.n = 0;
  Y._12_4_ = 0;
  TV.p._0_4_ = 1;
  U2.s = 0;
  U2.n = 0;
  U2._12_4_ = 0;
  TU.s = 0;
  TU.n = 0;
  TU._12_4_ = 0;
  V2.p._0_4_ = 1;
  TV.s = 0;
  TV.n = 0;
  TV._12_4_ = 0;
  iVar4 = mbedtls_mpi_gcd((mbedtls_mpi *)p_1,A,N);
  if (iVar4 == 0) {
    local_d8 = 1;
    Y.p._0_4_ = 0x10001;
    G._8_8_ = &local_d8;
    iVar5 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)p_1,(mbedtls_mpi *)&G.s);
    iVar4 = -0xe;
    if ((((((iVar5 == 0) && (iVar4 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&TB.s,A,N), iVar4 == 0)) &&
          (iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&TB.s), iVar4 == 0)) &&
         ((iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&Y.s,N), iVar4 == 0 &&
          (iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&U2.s,N), iVar4 == 0)))) &&
        ((iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&TA.s,1), iVar4 == 0 &&
         ((iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&U1.s,0), iVar4 == 0 &&
          (iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&TU.s,0), iVar4 == 0)))))) &&
       (iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&TV.s,1), iVar4 == 0)) {
      psVar1 = &TA.s;
      do {
        while ((*(byte *)V2._8_8_ & 1) == 0) {
          if ((ulong)TU.p._2_2_ != 0) {
            mbedtls_mpi_core_shift_r((mbedtls_mpi_uint *)V2._8_8_,(ulong)TU.p._2_2_,1);
          }
          if ((((*(byte *)TA._8_8_ & 1) != 0) || ((*(byte *)U1._8_8_ & 1) != 0)) &&
             ((iVar4 = add_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,(mbedtls_mpi *)&Y.s,1
                                  ), iVar4 != 0 ||
              (iVar4 = add_sub_mpi((mbedtls_mpi *)&U1.s,(mbedtls_mpi *)&U1.s,(mbedtls_mpi *)&TB.s,-1
                                  ), iVar4 != 0)))) goto LAB_00222356;
          if ((ulong)U1.p._2_2_ != 0) {
            mbedtls_mpi_core_shift_r((mbedtls_mpi_uint *)TA._8_8_,(ulong)U1.p._2_2_,1);
          }
          if ((ulong)U2.p._2_2_ != 0) {
            mbedtls_mpi_core_shift_r((mbedtls_mpi_uint *)U1._8_8_,(ulong)U2.p._2_2_,1);
          }
        }
        while ((*(byte *)U2._8_8_ & 1) == 0) {
          if ((ulong)TV.p._2_2_ != 0) {
            mbedtls_mpi_core_shift_r((mbedtls_mpi_uint *)U2._8_8_,(ulong)TV.p._2_2_,1);
          }
          if ((((*(byte *)TU._8_8_ & 1) != 0) || ((*(byte *)TV._8_8_ & 1) != 0)) &&
             ((iVar4 = add_sub_mpi((mbedtls_mpi *)&TU.s,(mbedtls_mpi *)&TU.s,(mbedtls_mpi *)&Y.s,1),
              iVar4 != 0 ||
              (iVar4 = add_sub_mpi((mbedtls_mpi *)&TV.s,(mbedtls_mpi *)&TV.s,(mbedtls_mpi *)&TB.s,-1
                                  ), iVar4 != 0)))) goto LAB_00222356;
          if ((ulong)V2.p._2_2_ != 0) {
            mbedtls_mpi_core_shift_r((mbedtls_mpi_uint *)TV._8_8_,(ulong)V2.p._2_2_,1);
          }
        }
        iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&U2.s);
        if (iVar4 < 0) {
          iVar4 = add_sub_mpi((mbedtls_mpi *)&U2.s,(mbedtls_mpi *)&U2.s,(mbedtls_mpi *)&V2.s,-1);
          if ((iVar4 != 0) ||
             (iVar4 = add_sub_mpi((mbedtls_mpi *)&TU.s,(mbedtls_mpi *)&TU.s,(mbedtls_mpi *)psVar1,-1
                                 ), iVar4 != 0)) goto LAB_00222356;
          pmVar2 = &TV;
          pmVar3 = &U1;
        }
        else {
          iVar4 = add_sub_mpi((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&U2.s,-1);
          if ((iVar4 != 0) ||
             (iVar4 = add_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,(mbedtls_mpi *)&TU.s,
                                  -1), iVar4 != 0)) goto LAB_00222356;
          pmVar2 = &U1;
          pmVar3 = &TV;
        }
        iVar4 = add_sub_mpi((mbedtls_mpi *)&pmVar2->s,(mbedtls_mpi *)&pmVar2->s,
                            (mbedtls_mpi *)&pmVar3->s,-1);
        if (iVar4 != 0) goto LAB_00222356;
        local_d8 = 0;
        Y.p._0_4_ = 0x10001;
        G._8_8_ = &local_d8;
        iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&G.s);
      } while (iVar4 != 0);
      psVar1 = &TU.s;
      do {
        local_d8 = 0;
        Y.p._0_4_ = 0x10001;
        G._8_8_ = &local_d8;
        iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)&G.s);
        if (-1 < iVar4) {
          psVar1 = &TU.s;
          goto LAB_00222817;
        }
        iVar4 = add_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,N,1);
      } while (iVar4 == 0);
    }
  }
  goto LAB_00222356;
  while (iVar4 = add_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,N,-1), iVar4 == 0) {
LAB_00222817:
    iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)psVar1,N);
    if (iVar4 < 0) {
      iVar4 = mbedtls_mpi_copy(X,(mbedtls_mpi *)&TU.s);
      break;
    }
  }
LAB_00222356:
  if (TB._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)TB._8_8_,(ulong)TA.p._2_2_ << 3);
  }
  TA.p._0_4_ = 1;
  TB.s = 0;
  TB.n = 0;
  TB._12_4_ = 0;
  if (V2._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)V2._8_8_,(ulong)TU.p._2_2_ << 3);
  }
  TU.p._0_4_ = 1;
  V2.s = 0;
  V2.n = 0;
  V2._12_4_ = 0;
  if (TA._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)TA._8_8_,(ulong)U1.p._2_2_ << 3);
  }
  U1.p._0_4_ = 1;
  TA.s = 0;
  TA.n = 0;
  TA._12_4_ = 0;
  if (U1._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)U1._8_8_,(ulong)U2.p._2_2_ << 3);
  }
  U2.p._0_4_ = 1;
  U1.s = 0;
  U1.n = 0;
  U1._12_4_ = 0;
  if (p_1[0] != 0) {
    mbedtls_zeroize_and_free((void *)p_1[0],(ulong)G.p._2_2_ << 3);
  }
  G.p._0_4_ = 1;
  p_1[0] = 0;
  if (Y._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)Y._8_8_,(ulong)TB.p._2_2_ << 3);
  }
  TB.p._0_4_ = 1;
  Y.s = 0;
  Y.n = 0;
  Y._12_4_ = 0;
  if (U2._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)U2._8_8_,(ulong)TV.p._2_2_ << 3);
  }
  TV.p._0_4_ = 1;
  U2.s = 0;
  U2.n = 0;
  U2._12_4_ = 0;
  if (TU._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)TU._8_8_,0);
  }
  TU.s = 0;
  TU.n = 0;
  TU._12_4_ = 0;
  if (TV._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)TV._8_8_,(ulong)V2.p._2_2_ << 3);
  }
  return iVar4;
}

Assistant:

int mbedtls_mpi_inv_mod(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(N != NULL);

    if (mbedtls_mpi_cmp_int(N, 1) <= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&TA); mbedtls_mpi_init(&TU); mbedtls_mpi_init(&U1); mbedtls_mpi_init(&U2);
    mbedtls_mpi_init(&G); mbedtls_mpi_init(&TB); mbedtls_mpi_init(&TV);
    mbedtls_mpi_init(&V1); mbedtls_mpi_init(&V2);

    MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(&G, A, N));

    if (mbedtls_mpi_cmp_int(&G, 1) != 0) {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&TA, A, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TU, &TA));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TV, N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U1, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U2, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V1, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V2, 1));

    do {
        while ((TU.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TU, 1));

            if ((U1.p[0] & 1) != 0 || (U2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&U1, &U1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U2, 1));
        }

        while ((TV.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TV, 1));

            if ((V1.p[0] & 1) != 0 || (V2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V2, 1));
        }

        if (mbedtls_mpi_cmp_mpi(&TU, &TV) >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TU, &TU, &TV));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U1, &U1, &V1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &V2));
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TV, &TV, &TU));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, &U1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &U2));
        }
    } while (mbedtls_mpi_cmp_int(&TU, 0) != 0);

    while (mbedtls_mpi_cmp_int(&V1, 0) < 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, N));
    }

    while (mbedtls_mpi_cmp_mpi(&V1, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, N));
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &V1));

cleanup:

    mbedtls_mpi_free(&TA); mbedtls_mpi_free(&TU); mbedtls_mpi_free(&U1); mbedtls_mpi_free(&U2);
    mbedtls_mpi_free(&G); mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TV);
    mbedtls_mpi_free(&V1); mbedtls_mpi_free(&V2);

    return ret;
}